

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multiann.cpp
# Opt level: O1

void __thiscall MultiANN::UpdateAnnArray(MultiANN *this)

{
  uint uVar1;
  ANNpointArray points;
  double dVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  ANN *pAVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  int local_38;
  
  uVar1 = this->size;
  if ((uVar1 & 0xf) == 0 && 0 < (int)uVar1) {
    iVar4 = 0;
    uVar9 = 0x1f;
    do {
      if (this->AnnArray[uVar9 - 1] != (ANN *)0x0) {
        iVar4 = ANN::LastNode(this->AnnArray[uVar9 - 1]);
      }
      uVar9 = uVar9 - 1;
    } while (4 < uVar9);
    if (iVar4 + 1 != this->size) {
      bVar3 = false;
      lVar8 = 10;
      do {
        lVar7 = lVar8;
        pAVar6 = this->AnnArray[lVar7 + -6];
        if (pAVar6 == (ANN *)0x0) {
          bVar3 = true;
        }
        else {
          ANN::~ANN(pAVar6);
          operator_delete(pAVar6);
          this->AnnArray[lVar7 + -6] = (ANN *)0x0;
        }
        lVar8 = lVar7 + 1;
      } while ((lVar7 - 7U < 0x1e) && (!bVar3));
      local_38 = (int)lVar7 + -6;
      iVar4 = 0;
      uVar9 = 0;
      if (uVar1 != 0x10) {
        uVar9 = lVar7 - 7;
        bVar3 = false;
        if (uVar9 < 0x1e) {
          do {
            if (this->AnnArray[lVar8 + -7] != (ANN *)0x0) {
              iVar5 = ANN::LastNode(this->AnnArray[lVar8 + -7]);
              uVar9 = (ulong)(iVar5 + 1);
              bVar3 = true;
            }
          } while ((lVar8 - 7U < 0x1e) && (lVar8 = lVar8 + 1, !bVar3));
        }
      }
      if (bVar3) {
        iVar4 = (int)uVar9;
      }
      pAVar6 = (ANN *)operator_new(0x40);
      points = this->points_coor;
      iVar5 = this->size;
      dVar2 = exp2((double)local_38);
      ANN::ANN(pAVar6,points,iVar4,iVar5,(int)dVar2,this->dimension,this->topology,this->scaling,
               this->NumNeighbors);
      this->AnnArray[lVar7 + -6] = pAVar6;
    }
  }
  return;
}

Assistant:

void MultiANN::UpdateAnnArray()  // updates the arrays of data points
{
    int j, k, num;
    int n, n_last;
    bool done;

    num = size;
    n_last = 0;  // Just to make warnings go away

    if ((num > 0) && (num % ((int)pow((double)2, ANN_STARTING_INDEX)) ==
                      0)) {  // Check if it is time to update the ANNs

        for (k = ANN_MAXIMUM_INDEX; k >= ANN_STARTING_INDEX; k--) {
            if (AnnArray[k])
                n_last = AnnArray[k]->LastNode();  // Make sure update has not
                                                   // been performed
        }
        n_last++;

        if (n_last != size) {  // If equal, then update already performed

            k = ANN_STARTING_INDEX - 1;
            done = false;
            while ((k <= ANN_MAXIMUM_INDEX) && (!done)) {
                k++;
                if (!AnnArray[k]) {  // If there is no tree, then make one
                    done = true;
                } else {
                    delete (AnnArray[k]);  // Blow this one away; these nodes
                                           // are moved up
                    AnnArray[k] = NULL;
                }
            }

            if ((num == ((int)pow((double)2, ANN_STARTING_INDEX))))  // k should
                                                                     // be the
                                                                     // location
                                                                     // for
                                                                     // making
                                                                     // the new
                                                                     // ANN tree
                n = 0;  // Need to find the starting node in G for the new ANN
                        // tree
            else {
                j = k;
                done = false;
                while ((j <= ANN_MAXIMUM_INDEX) && (!done)) {
                    if (AnnArray[j]) {
                        n = AnnArray[j]->LastNode();
                        n++;
                        done = true;
                    }
                    j++;
                }
            }

            if (!done) n = 0;

            AnnArray[k] =
                new ANN(points_coor, n, size, (int)pow((double)2, k), dimension,
                        topology, scaling,
                        NumNeighbors);  // Finally, make the new ANN tree

            // cout << "New ANN Tree:  k: " << k << " num: " << num << "\n";
            // for (j = ANN_MAXIMUM_INDEX; j >= ANN_STARTING_INDEX; j--) {
            // 	cout << (AnnArray[j] ? "X" : ".");
            //}
            // cout << "\n";
        }
    }
}